

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_chars.hpp
# Opt level: O1

boundaries * nlohmann::json_abi_v3_11_2::detail::dtoa_impl::compute_boundaries<double>(double value)

{
  int iVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  boundaries *in_RDI;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  
  uVar8 = (ulong)value & 0xfffffffffffff;
  bVar10 = (ulong)value >> 0x34 == 0;
  uVar6 = uVar8 | 0x10000000000000;
  if (bVar10) {
    uVar6 = uVar8;
  }
  iVar9 = -0x432;
  if (!bVar10) {
    iVar9 = (uint)((ulong)value >> 0x34) - 0x433;
  }
  uVar3 = uVar6 * 2 + 1;
  iVar7 = iVar9 + -1;
  do {
    uVar3 = uVar3 * 2;
    iVar7 = iVar7 + -1;
    uVar4 = uVar6;
    iVar5 = iVar9;
  } while (-1 < (long)uVar3);
  do {
    uVar4 = uVar4 * 2;
    iVar5 = iVar5 + -1;
  } while (-1 < (long)uVar4);
  iVar1 = iVar9 + -1;
  lVar2 = uVar6 * 2;
  if ((ulong)value >> 0x35 != 0 && uVar8 == 0) {
    iVar1 = iVar9 + -2;
    lVar2 = uVar6 << 2;
  }
  (in_RDI->w).f = uVar4;
  (in_RDI->w).e = iVar5;
  (in_RDI->minus).f = lVar2 + -1 << ((char)iVar1 - (char)iVar7 & 0x3fU);
  (in_RDI->minus).e = iVar7;
  (in_RDI->plus).f = uVar3;
  (in_RDI->plus).e = iVar7;
  return in_RDI;
}

Assistant:

boundaries compute_boundaries(FloatType value)
{
    JSON_ASSERT(std::isfinite(value));
    JSON_ASSERT(value > 0);

    // Convert the IEEE representation into a diyfp.
    //
    // If v is denormal:
    //      value = 0.F * 2^(1 - bias) = (          F) * 2^(1 - bias - (p-1))
    // If v is normalized:
    //      value = 1.F * 2^(E - bias) = (2^(p-1) + F) * 2^(E - bias - (p-1))

    static_assert(std::numeric_limits<FloatType>::is_iec559,
                  "internal error: dtoa_short requires an IEEE-754 floating-point implementation");

    constexpr int      kPrecision = std::numeric_limits<FloatType>::digits; // = p (includes the hidden bit)
    constexpr int      kBias      = std::numeric_limits<FloatType>::max_exponent - 1 + (kPrecision - 1);
    constexpr int      kMinExp    = 1 - kBias;
    constexpr std::uint64_t kHiddenBit = std::uint64_t{1} << (kPrecision - 1); // = 2^(p-1)

    using bits_type = typename std::conditional<kPrecision == 24, std::uint32_t, std::uint64_t >::type;

    const auto bits = static_cast<std::uint64_t>(reinterpret_bits<bits_type>(value));
    const std::uint64_t E = bits >> (kPrecision - 1);
    const std::uint64_t F = bits & (kHiddenBit - 1);

    const bool is_denormal = E == 0;
    const diyfp v = is_denormal
                    ? diyfp(F, kMinExp)
                    : diyfp(F + kHiddenBit, static_cast<int>(E) - kBias);

    // Compute the boundaries m- and m+ of the floating-point value
    // v = f * 2^e.
    //
    // Determine v- and v+, the floating-point predecessor and successor if v,
    // respectively.
    //
    //      v- = v - 2^e        if f != 2^(p-1) or e == e_min                (A)
    //         = v - 2^(e-1)    if f == 2^(p-1) and e > e_min                (B)
    //
    //      v+ = v + 2^e
    //
    // Let m- = (v- + v) / 2 and m+ = (v + v+) / 2. All real numbers _strictly_
    // between m- and m+ round to v, regardless of how the input rounding
    // algorithm breaks ties.
    //
    //      ---+-------------+-------------+-------------+-------------+---  (A)
    //         v-            m-            v             m+            v+
    //
    //      -----------------+------+------+-------------+-------------+---  (B)
    //                       v-     m-     v             m+            v+

    const bool lower_boundary_is_closer = F == 0 && E > 1;
    const diyfp m_plus = diyfp(2 * v.f + 1, v.e - 1);
    const diyfp m_minus = lower_boundary_is_closer
                          ? diyfp(4 * v.f - 1, v.e - 2)  // (B)
                          : diyfp(2 * v.f - 1, v.e - 1); // (A)

    // Determine the normalized w+ = m+.
    const diyfp w_plus = diyfp::normalize(m_plus);

    // Determine w- = m- such that e_(w-) = e_(w+).
    const diyfp w_minus = diyfp::normalize_to(m_minus, w_plus.e);

    return {diyfp::normalize(v), w_minus, w_plus};
}